

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_interface.cpp
# Opt level: O1

int isotree_predict_distance
              (void *isotree_model,uint8_t output_triangular,uint8_t as_kernel,uint8_t standardize,
              uint8_t assume_full_distr,double *output_dist,size_t nrows,double *numeric_data,
              int *categ_data,double *csc_values,int *csc_indices,int *csc_indptr)

{
  long lVar1;
  char *pcVar2;
  
  if (isotree_model == (void *)0x0) {
    pcVar2 = "Passed NULL \'isotree_model\' to \'isotree_predict_distance\'.";
    lVar1 = 0x3a;
  }
  else {
    if (output_dist != (double *)0x0) {
      if (csc_indptr == (int *)0x0) {
        isotree::IsolationForest::predict_distance
                  ((IsolationForest *)isotree_model,numeric_data,categ_data,nrows,as_kernel != '\0',
                   assume_full_distr != '\0',standardize != '\0',output_triangular != '\0',
                   output_dist);
      }
      else {
        isotree::IsolationForest::predict_distance
                  ((IsolationForest *)isotree_model,csc_values,csc_indices,csc_indptr,categ_data,
                   nrows,as_kernel != '\0',assume_full_distr != '\0',standardize != '\0',
                   output_triangular != '\0',output_dist);
      }
      return 0;
    }
    pcVar2 = "Passed NULL \'output_dist\' to \'isotree_predict_distance\'.";
    lVar1 = 0x38;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar2,lVar1);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'H');
  std::ostream::put('H');
  std::ostream::flush();
  return 1;
}

Assistant:

ISOTREE_EXPORTED
int isotree_predict_distance
(
    void *isotree_model,
    uint8_t output_triangular,
    uint8_t as_kernel,
    uint8_t standardize,
    uint8_t assume_full_distr,
    double *output_dist,
    size_t nrows,
    double *numeric_data,
    int *categ_data,
    double *csc_values,
    int *csc_indices,
    int *csc_indptr
)
{
    if (!isotree_model) {
        cerr << "Passed NULL 'isotree_model' to 'isotree_predict_distance'." << std::endl;
        return IsoTreeError;
    }
    if (!output_dist) {
        cerr << "Passed NULL 'output_dist' to 'isotree_predict_distance'." << std::endl;
        return IsoTreeError;
    }
    IsolationForest *model = (IsolationForest*)isotree_model;

    try
    {
        if (!csc_indptr) {
            model->predict_distance(numeric_data, categ_data,
                                    nrows, as_kernel,
                                    (bool) assume_full_distr, (bool) standardize,
                                    (bool) output_triangular,
                                    output_dist);
        }

        else {
            model->predict_distance(csc_values, csc_indices, csc_indptr, categ_data,
                                    nrows, as_kernel, (bool) assume_full_distr, (bool) standardize,
                                    (bool) output_triangular,
                                    output_dist);
        }

        return IsoTreeSuccess;
    }

    catch (std::exception &e)
    {
        cerr << e.what();
        cerr.flush();
    }

    return IsoTreeError;
}